

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::parseResponse(Client *this,int64_t id,Value *result,Value *error)

{
  bool bVar1;
  uint uVar2;
  Ch *error_00;
  char *pcVar3;
  Type pGVar4;
  Value *in_RCX;
  BaseClient *in_RDX;
  int iVar5;
  int64_t in_RSI;
  Client *in_RDI;
  int code;
  char *message;
  Client *in_stack_ffffffffffffffa8;
  IClientListener *name;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffb0;
  Job *this_00;
  int *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd8;
  Ch *pCVar6;
  
  bVar1 = BaseClient::handleResponse(&in_RDI->super_BaseClient,in_RSI,(Value *)in_RDX,in_RCX);
  if (!bVar1) {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(in_RCX);
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8)
      ;
      iVar5 = (int)in_RSI;
      error_00 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar4);
      bVar1 = BaseClient::handleSubmitResponse(in_RDX,(int64_t)in_RCX,error_00);
      pCVar6 = error_00;
      if ((!bVar1) &&
         (bVar1 = BaseClient::isQuiet(&in_RDI->super_BaseClient), pCVar6 = error_00, !bVar1)) {
        pcVar3 = url((Client *)0x1c15e2);
        pCVar6 = error_00;
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
        uVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(pGVar4);
        iVar5 = 0x27a5e5;
        Log::print(ERR,"[%s] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",pcVar3,error_00,
                   (ulong)uVar2);
      }
      if ((in_RDI->super_BaseClient).m_id != 1) {
        iVar5 = (int)pCVar6;
        bVar1 = isCriticalError(in_stack_ffffffffffffffa8,(char *)0x1c1644);
        if (!bVar1) {
          return;
        }
      }
      close(in_RDI,iVar5);
    }
    else {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)in_RDX);
      if (bVar1) {
        if (in_RSI == 1) {
          iVar5 = (int)in_RDX;
          bVar1 = parseLogin(in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          if (bVar1) {
            (in_RDI->super_BaseClient).m_failures = 0;
            (*((in_RDI->super_BaseClient).m_listener)->_vptr_IClientListener[5])();
            name = (in_RDI->super_BaseClient).m_listener;
            this_00 = &(in_RDI->super_BaseClient).m_job;
            pGVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)this_00,(char *)name);
            (*name->_vptr_IClientListener[3])(name,in_RDI,this_00,pGVar4);
          }
          else {
            bVar1 = BaseClient::isQuiet(&in_RDI->super_BaseClient);
            if (!bVar1) {
              pcVar3 = url((Client *)0x1c16b0);
              iVar5 = 0x27a612;
              Log::print(ERR,"[%s] login error code: %d",pcVar3,0xffffffff);
            }
            close(in_RDI,iVar5);
          }
        }
        else {
          BaseClient::handleSubmitResponse(in_RDX,(int64_t)in_RCX,in_stack_ffffffffffffffd8);
        }
      }
    }
  }
  return;
}

Assistant:

void xmrig::Client::parseResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (handleResponse(id, result, error)) {
        return;
    }

    if (error.IsObject()) {
        const char *message = error["message"].GetString();

        if (!handleSubmitResponse(id, message) && !isQuiet()) {
            LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", url(), message, error["code"].GetInt());
        }

        if (m_id == 1 || isCriticalError(message)) {
            close();
        }

        return;
    }

    if (!result.IsObject()) {
        return;
    }

    if (id == 1) {
        int code = -1;
        if (!parseLogin(result, &code)) {
            if (!isQuiet()) {
                LOG_ERR("[%s] login error code: %d", url(), code);
            }

            close();
            return;
        }

        m_failures = 0;
        m_listener->onLoginSuccess(this);
        m_listener->onJobReceived(this, m_job, result["job"]);
        return;
    }

    handleSubmitResponse(id);
}